

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O0

Sequence<DNA> * __thiscall
Sequence<DNA>::Reverse(Sequence<DNA> *__return_storage_ptr__,Sequence<DNA> *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  Sequence<DNA> *this_local;
  Sequence<DNA> *rev;
  
  Sequence(__return_storage_ptr__,this);
  _Var1._M_current = (char *)std::__cxx11::string::begin();
  _Var2._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(_Var1,_Var2);
  _Var1._M_current = (char *)std::__cxx11::string::begin();
  _Var2._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(_Var1,_Var2);
  return __return_storage_ptr__;
}

Assistant:

Sequence< A > Sequence< A >::Reverse() const {
  Sequence rev = *this;
  // Reverse sequence and quality
  std::reverse( rev.sequence.begin(), rev.sequence.end() );
  std::reverse( rev.quality.begin(), rev.quality.end() );
  return rev;
}